

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  size_t sVar2;
  undefined8 uVar3;
  Scene *pSVar4;
  Ref<embree::Geometry> *pRVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 (*pauVar12) [16];
  long lVar13;
  ulong uVar14;
  long lVar15;
  undefined1 (*pauVar16) [16];
  undefined1 (*pauVar17) [16];
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong unaff_R12;
  size_t mask;
  ulong uVar21;
  size_t sVar22;
  int iVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined1 (*unaff_R14) [16];
  Geometry *pGVar26;
  ulong uVar27;
  long lVar28;
  float fVar29;
  uint uVar30;
  float fVar40;
  float fVar42;
  vint4 bi;
  uint uVar41;
  uint uVar43;
  float fVar46;
  uint uVar47;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar44;
  float fVar45;
  float fVar48;
  float fVar49;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar50;
  float fVar56;
  float fVar58;
  vint4 ai;
  uint uVar51;
  uint uVar57;
  uint uVar59;
  float fVar60;
  uint uVar61;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  vint4 ai_1;
  undefined1 auVar62 [16];
  float fVar63;
  float fVar64;
  float fVar71;
  float fVar73;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar72;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar88;
  int iVar89;
  float fVar90;
  int iVar91;
  float fVar92;
  vint4 bi_1;
  int iVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  int iVar123;
  int iVar124;
  int iVar125;
  int iVar126;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float local_10d8 [4];
  float local_10c8 [4];
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  undefined1 local_10a8 [16];
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1078 [16];
  float local_1068 [4];
  float local_1058 [4];
  undefined1 local_1048 [16];
  float local_1038 [4];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  int local_1008;
  int iStack_1004;
  int iStack_1000;
  int iStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  size_t local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  pauVar17 = (undefined1 (*) [16])local_f68;
  local_f78 = root.ptr;
  uStack_f70 = 0;
  local_fa8 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_fb8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_fc8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_fd8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_fe8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_ff8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar14 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1008 = (tray->tnear).field_0.i[k];
  iVar23 = (tray->tfar).field_0.i[k];
  fStack_fa4 = local_fa8;
  fStack_fa0 = local_fa8;
  fStack_f9c = local_fa8;
  fStack_fb4 = local_fb8;
  fStack_fb0 = local_fb8;
  fStack_fac = local_fb8;
  fStack_fc4 = local_fc8;
  fStack_fc0 = local_fc8;
  fStack_fbc = local_fc8;
  fStack_fd4 = local_fd8;
  fStack_fd0 = local_fd8;
  fStack_fcc = local_fd8;
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  iStack_1004 = local_1008;
  iStack_1000 = local_1008;
  iStack_ffc = local_1008;
  fVar81 = local_fa8;
  fVar82 = local_fa8;
  fVar83 = local_fa8;
  fVar84 = local_fa8;
  iVar89 = iVar23;
  iVar91 = iVar23;
  iVar93 = iVar23;
  fVar64 = local_fb8;
  fVar72 = local_fb8;
  fVar74 = local_fb8;
  fVar76 = local_fb8;
  fVar95 = local_fc8;
  fVar96 = local_fc8;
  fVar97 = local_fc8;
  fVar98 = local_fc8;
  fVar99 = local_fd8;
  fVar101 = local_fd8;
  fVar103 = local_fd8;
  fVar105 = local_fd8;
  fVar107 = local_fe8;
  fVar109 = local_fe8;
  fVar111 = local_fe8;
  fVar113 = local_fe8;
  fVar115 = local_ff8;
  fVar117 = local_ff8;
  fVar119 = local_ff8;
  fVar121 = local_ff8;
  iVar123 = local_1008;
  iVar124 = local_1008;
  iVar125 = local_1008;
  iVar126 = local_1008;
  do {
    do {
      do {
        pauVar12 = (undefined1 (*) [16])&local_f78;
        if (pauVar17 == pauVar12) {
          return;
        }
        pauVar16 = pauVar17 + -1;
        pauVar17 = pauVar17 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) <= *(float *)((long)*pauVar16 + 8) &&
               *(float *)((long)*pauVar16 + 8) != *(float *)(ray + k * 4 + 0x80));
      sVar22 = *(size_t *)*pauVar17;
      pauVar16 = pauVar17;
      do {
        if ((sVar22 & 8) == 0) {
          pfVar1 = (float *)(sVar22 + 0x20 + uVar14);
          fVar29 = (*pfVar1 - fVar81) * fVar99;
          fVar40 = (pfVar1[1] - fVar82) * fVar101;
          fVar42 = (pfVar1[2] - fVar83) * fVar103;
          fVar46 = (pfVar1[3] - fVar84) * fVar105;
          pfVar1 = (float *)(sVar22 + 0x20 + uVar18);
          fVar50 = (*pfVar1 - fVar64) * fVar107;
          fVar56 = (pfVar1[1] - fVar72) * fVar109;
          fVar58 = (pfVar1[2] - fVar74) * fVar111;
          fVar60 = (pfVar1[3] - fVar76) * fVar113;
          uVar51 = (uint)((int)fVar50 < (int)fVar29) * (int)fVar29 |
                   (uint)((int)fVar50 >= (int)fVar29) * (int)fVar50;
          uVar57 = (uint)((int)fVar56 < (int)fVar40) * (int)fVar40 |
                   (uint)((int)fVar56 >= (int)fVar40) * (int)fVar56;
          uVar59 = (uint)((int)fVar58 < (int)fVar42) * (int)fVar42 |
                   (uint)((int)fVar58 >= (int)fVar42) * (int)fVar58;
          uVar61 = (uint)((int)fVar60 < (int)fVar46) * (int)fVar46 |
                   (uint)((int)fVar60 >= (int)fVar46) * (int)fVar60;
          pfVar1 = (float *)(sVar22 + 0x20 + uVar19);
          fVar29 = (*pfVar1 - fVar95) * fVar115;
          fVar40 = (pfVar1[1] - fVar96) * fVar117;
          fVar42 = (pfVar1[2] - fVar97) * fVar119;
          fVar46 = (pfVar1[3] - fVar98) * fVar121;
          uVar30 = (uint)((int)fVar29 < iVar123) * iVar123 |
                   (uint)((int)fVar29 >= iVar123) * (int)fVar29;
          uVar41 = (uint)((int)fVar40 < iVar124) * iVar124 |
                   (uint)((int)fVar40 >= iVar124) * (int)fVar40;
          uVar43 = (uint)((int)fVar42 < iVar125) * iVar125 |
                   (uint)((int)fVar42 >= iVar125) * (int)fVar42;
          uVar47 = (uint)((int)fVar46 < iVar126) * iVar126 |
                   (uint)((int)fVar46 >= iVar126) * (int)fVar46;
          local_10c8[0] =
               (float)(((int)uVar30 < (int)uVar51) * uVar51 | ((int)uVar30 >= (int)uVar51) * uVar30)
          ;
          local_10c8[1] =
               (float)(((int)uVar41 < (int)uVar57) * uVar57 | ((int)uVar41 >= (int)uVar57) * uVar41)
          ;
          local_10c8[2] =
               (float)(((int)uVar43 < (int)uVar59) * uVar59 | ((int)uVar43 >= (int)uVar59) * uVar43)
          ;
          local_10c8[3] =
               (float)(((int)uVar47 < (int)uVar61) * uVar61 | ((int)uVar47 >= (int)uVar61) * uVar47)
          ;
          pfVar1 = (float *)(sVar22 + 0x20 + (uVar14 ^ 0x10));
          fVar29 = (*pfVar1 - fVar81) * fVar99;
          fVar40 = (pfVar1[1] - fVar82) * fVar101;
          fVar42 = (pfVar1[2] - fVar83) * fVar103;
          fVar46 = (pfVar1[3] - fVar84) * fVar105;
          pfVar1 = (float *)(sVar22 + 0x20 + (uVar18 ^ 0x10));
          fVar50 = (*pfVar1 - fVar64) * fVar107;
          fVar56 = (pfVar1[1] - fVar72) * fVar109;
          fVar58 = (pfVar1[2] - fVar74) * fVar111;
          fVar60 = (pfVar1[3] - fVar76) * fVar113;
          uVar51 = (uint)((int)fVar29 < (int)fVar50) * (int)fVar29 |
                   (uint)((int)fVar29 >= (int)fVar50) * (int)fVar50;
          uVar57 = (uint)((int)fVar40 < (int)fVar56) * (int)fVar40 |
                   (uint)((int)fVar40 >= (int)fVar56) * (int)fVar56;
          uVar59 = (uint)((int)fVar42 < (int)fVar58) * (int)fVar42 |
                   (uint)((int)fVar42 >= (int)fVar58) * (int)fVar58;
          uVar61 = (uint)((int)fVar46 < (int)fVar60) * (int)fVar46 |
                   (uint)((int)fVar46 >= (int)fVar60) * (int)fVar60;
          pfVar1 = (float *)(sVar22 + 0x20 + (uVar19 ^ 0x10));
          fVar29 = (*pfVar1 - fVar95) * fVar115;
          fVar40 = (pfVar1[1] - fVar96) * fVar117;
          fVar42 = (pfVar1[2] - fVar97) * fVar119;
          fVar46 = (pfVar1[3] - fVar98) * fVar121;
          uVar30 = (uint)(iVar23 < (int)fVar29) * iVar23 |
                   (uint)(iVar23 >= (int)fVar29) * (int)fVar29;
          uVar41 = (uint)(iVar89 < (int)fVar40) * iVar89 |
                   (uint)(iVar89 >= (int)fVar40) * (int)fVar40;
          uVar43 = (uint)(iVar91 < (int)fVar42) * iVar91 |
                   (uint)(iVar91 >= (int)fVar42) * (int)fVar42;
          uVar47 = (uint)(iVar93 < (int)fVar46) * iVar93 |
                   (uint)(iVar93 >= (int)fVar46) * (int)fVar46;
          auVar52._0_4_ =
               -(uint)((int)(((int)uVar51 < (int)uVar30) * uVar51 |
                            ((int)uVar51 >= (int)uVar30) * uVar30) < (int)local_10c8[0]);
          auVar52._4_4_ =
               -(uint)((int)(((int)uVar57 < (int)uVar41) * uVar57 |
                            ((int)uVar57 >= (int)uVar41) * uVar41) < (int)local_10c8[1]);
          auVar52._8_4_ =
               -(uint)((int)(((int)uVar59 < (int)uVar43) * uVar59 |
                            ((int)uVar59 >= (int)uVar43) * uVar43) < (int)local_10c8[2]);
          auVar52._12_4_ =
               -(uint)((int)(((int)uVar61 < (int)uVar47) * uVar61 |
                            ((int)uVar61 >= (int)uVar47) * uVar47) < (int)local_10c8[3]);
          uVar30 = movmskps((int)pauVar12,auVar52);
          unaff_R12 = ((ulong)uVar30 ^ 0xf) & 0xff;
        }
        pauVar17 = pauVar16;
        if ((sVar22 & 8) == 0) {
          if (unaff_R12 == 0) {
            pauVar12 = (undefined1 (*) [16])0x4;
          }
          else {
            uVar21 = sVar22 & 0xfffffffffffffff0;
            unaff_R14 = (undefined1 (*) [16])0x0;
            if (unaff_R12 != 0) {
              for (; (unaff_R12 >> (long)unaff_R14 & 1) == 0;
                  unaff_R14 = (undefined1 (*) [16])((long)*unaff_R14 + 1)) {
              }
            }
            pauVar12 = (undefined1 (*) [16])0x0;
            sVar22 = *(size_t *)(uVar21 + (long)unaff_R14 * 8);
            uVar27 = unaff_R12 - 1 & unaff_R12;
            if (uVar27 != 0) {
              fVar29 = local_10c8[(long)unaff_R14];
              lVar15 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                }
              }
              sVar2 = *(size_t *)(uVar21 + lVar15 * 8);
              fVar40 = local_10c8[lVar15];
              uVar27 = uVar27 - 1 & uVar27;
              if (uVar27 == 0) {
                pauVar17 = pauVar16 + 1;
                unaff_R14 = pauVar17;
                if ((uint)fVar29 < (uint)fVar40) {
                  *(size_t *)*pauVar16 = sVar2;
                  *(float *)((long)*pauVar16 + 8) = fVar40;
                }
                else {
                  *(size_t *)*pauVar16 = sVar22;
                  *(float *)((long)*pauVar16 + 8) = fVar29;
                  sVar22 = sVar2;
                }
              }
              else {
                auVar66._8_4_ = fVar29;
                auVar66._0_8_ = sVar22;
                auVar66._12_4_ = 0;
                auVar67._8_4_ = fVar40;
                auVar67._0_8_ = sVar2;
                auVar67._12_4_ = 0;
                lVar15 = 0;
                if (uVar27 != 0) {
                  for (; (uVar27 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                  }
                }
                uVar3 = *(undefined8 *)(uVar21 + lVar15 * 8);
                fVar42 = local_10c8[lVar15];
                auVar78._8_4_ = fVar42;
                auVar78._0_8_ = uVar3;
                auVar78._12_4_ = 0;
                auVar85._8_4_ = -(uint)((int)fVar29 < (int)fVar40);
                uVar27 = uVar27 - 1 & uVar27;
                if (uVar27 == 0) {
                  auVar85._4_4_ = auVar85._8_4_;
                  auVar85._0_4_ = auVar85._8_4_;
                  auVar85._12_4_ = auVar85._8_4_;
                  auVar62._8_4_ = fVar40;
                  auVar62._0_8_ = sVar2;
                  auVar62._12_4_ = 0;
                  auVar52 = blendvps(auVar62,auVar66,auVar85);
                  auVar85 = blendvps(auVar66,auVar67,auVar85);
                  auVar31._8_4_ = -(uint)(auVar52._8_4_ < (int)fVar42);
                  auVar31._4_4_ = auVar31._8_4_;
                  auVar31._0_4_ = auVar31._8_4_;
                  auVar31._12_4_ = auVar31._8_4_;
                  auVar65._8_4_ = fVar42;
                  auVar65._0_8_ = uVar3;
                  auVar65._12_4_ = 0;
                  auVar66 = blendvps(auVar65,auVar52,auVar31);
                  auVar67 = blendvps(auVar52,auVar78,auVar31);
                  auVar32._8_4_ = -(uint)(auVar85._8_4_ < auVar67._8_4_);
                  auVar32._4_4_ = auVar32._8_4_;
                  auVar32._0_4_ = auVar32._8_4_;
                  auVar32._12_4_ = auVar32._8_4_;
                  auVar52 = blendvps(auVar67,auVar85,auVar32);
                  auVar67 = blendvps(auVar85,auVar67,auVar32);
                  *pauVar16 = auVar67;
                  pauVar16[1] = auVar52;
                  sVar22 = auVar66._0_8_;
                  pauVar17 = pauVar16 + 2;
                  unaff_R14 = (undefined1 (*) [16])0x0;
                }
                else {
                  unaff_R14 = (undefined1 (*) [16])0x0;
                  if (uVar27 != 0) {
                    for (; (uVar27 >> (long)unaff_R14 & 1) == 0;
                        unaff_R14 = (undefined1 (*) [16])((long)*unaff_R14 + 1)) {
                    }
                  }
                  auVar86._4_4_ = auVar85._8_4_;
                  auVar86._0_4_ = auVar85._8_4_;
                  auVar86._8_4_ = auVar85._8_4_;
                  auVar86._12_4_ = auVar85._8_4_;
                  auVar85 = blendvps(auVar67,auVar66,auVar86);
                  auVar66 = blendvps(auVar66,auVar67,auVar86);
                  auVar77._8_4_ = local_10c8[(long)unaff_R14];
                  auVar77._0_8_ = *(undefined8 *)(uVar21 + (long)unaff_R14 * 8);
                  auVar77._12_4_ = 0;
                  auVar33._8_4_ = -(uint)((int)fVar42 < (int)local_10c8[(long)unaff_R14]);
                  auVar33._4_4_ = auVar33._8_4_;
                  auVar33._0_4_ = auVar33._8_4_;
                  auVar33._12_4_ = auVar33._8_4_;
                  auVar67 = blendvps(auVar77,auVar78,auVar33);
                  auVar52 = blendvps(auVar78,auVar77,auVar33);
                  auVar34._8_4_ = -(uint)(auVar66._8_4_ < auVar52._8_4_);
                  auVar34._4_4_ = auVar34._8_4_;
                  auVar34._0_4_ = auVar34._8_4_;
                  auVar34._12_4_ = auVar34._8_4_;
                  auVar78 = blendvps(auVar52,auVar66,auVar34);
                  auVar86 = blendvps(auVar66,auVar52,auVar34);
                  auVar35._8_4_ = -(uint)(auVar85._8_4_ < auVar67._8_4_);
                  auVar35._4_4_ = auVar35._8_4_;
                  auVar35._0_4_ = auVar35._8_4_;
                  auVar35._12_4_ = auVar35._8_4_;
                  auVar52 = blendvps(auVar67,auVar85,auVar35);
                  auVar67 = blendvps(auVar85,auVar67,auVar35);
                  auVar36._8_4_ = -(uint)(auVar67._8_4_ < auVar78._8_4_);
                  auVar36._4_4_ = auVar36._8_4_;
                  auVar36._0_4_ = auVar36._8_4_;
                  auVar36._12_4_ = auVar36._8_4_;
                  auVar66 = blendvps(auVar78,auVar67,auVar36);
                  auVar67 = blendvps(auVar67,auVar78,auVar36);
                  *pauVar16 = auVar86;
                  pauVar16[1] = auVar67;
                  pauVar16[2] = auVar66;
                  sVar22 = auVar52._0_8_;
                  pauVar12 = (undefined1 (*) [16])0x0;
                  pauVar17 = pauVar16 + 3;
                }
              }
            }
          }
        }
        else {
          pauVar12 = (undefined1 (*) [16])0x6;
        }
        pauVar16 = pauVar17;
      } while ((int)pauVar12 == 0);
    } while ((int)pauVar12 != 6);
    uVar21 = (ulong)((uint)sVar22 & 0xf);
    if (uVar21 != 8) {
      uVar27 = sVar22 & 0xfffffffffffffff0;
      fVar81 = *(float *)(ray + k * 4);
      fVar82 = *(float *)(ray + k * 4 + 0x10);
      fVar83 = *(float *)(ray + k * 4 + 0x20);
      fVar84 = *(float *)(ray + k * 4 + 0x40);
      local_f88 = *(float *)(ray + k * 4 + 0x50);
      fStack_f84 = local_f88;
      fStack_f80 = local_f88;
      fStack_f7c = local_f88;
      local_f98 = *(float *)(ray + k * 4 + 0x60);
      fStack_f94 = local_f98;
      fStack_f90 = local_f98;
      fStack_f8c = local_f98;
      lVar15 = 0;
      do {
        lVar28 = lVar15 * 0xb0;
        pfVar1 = (float *)(uVar27 + 0x80 + lVar28);
        fVar64 = *pfVar1;
        fVar72 = pfVar1[1];
        fVar74 = pfVar1[2];
        fVar76 = pfVar1[3];
        pfVar1 = (float *)(uVar27 + 0x40 + lVar28);
        fVar95 = *pfVar1;
        fVar96 = pfVar1[1];
        fVar97 = pfVar1[2];
        fVar98 = pfVar1[3];
        pfVar1 = (float *)(uVar27 + 0x70 + lVar28);
        fVar99 = *pfVar1;
        fVar101 = pfVar1[1];
        fVar103 = pfVar1[2];
        fVar105 = pfVar1[3];
        pfVar1 = (float *)(uVar27 + 0x50 + lVar28);
        fVar107 = *pfVar1;
        fVar109 = pfVar1[1];
        fVar111 = pfVar1[2];
        fVar113 = pfVar1[3];
        local_1038[0] = fVar99 * fVar107 - fVar64 * fVar95;
        local_1038[1] = fVar101 * fVar109 - fVar72 * fVar96;
        local_1038[2] = fVar103 * fVar111 - fVar74 * fVar97;
        local_1038[3] = fVar105 * fVar113 - fVar76 * fVar98;
        pfVar1 = (float *)(uVar27 + 0x60 + lVar28);
        fVar115 = *pfVar1;
        fVar117 = pfVar1[1];
        fVar119 = pfVar1[2];
        fVar121 = pfVar1[3];
        pfVar1 = (float *)(uVar27 + lVar28);
        fVar50 = *pfVar1 - fVar81;
        fVar58 = pfVar1[1] - fVar81;
        fVar44 = pfVar1[2] - fVar81;
        fVar48 = pfVar1[3] - fVar81;
        pfVar1 = (float *)(uVar27 + 0x10 + lVar28);
        fVar116 = *pfVar1 - fVar82;
        fVar118 = pfVar1[1] - fVar82;
        fVar120 = pfVar1[2] - fVar82;
        fVar122 = pfVar1[3] - fVar82;
        fVar108 = local_f88 * fVar50 - fVar84 * fVar116;
        fVar110 = fStack_f84 * fVar58 - fVar84 * fVar118;
        fVar112 = fStack_f80 * fVar44 - fVar84 * fVar120;
        fVar114 = fStack_f7c * fVar48 - fVar84 * fVar122;
        pfVar1 = (float *)(uVar27 + 0x20 + lVar28);
        fVar63 = *pfVar1 - fVar83;
        fVar71 = pfVar1[1] - fVar83;
        fVar73 = pfVar1[2] - fVar83;
        fVar75 = pfVar1[3] - fVar83;
        pfVar1 = (float *)(uVar27 + 0x30 + lVar28);
        fVar29 = *pfVar1;
        fVar40 = pfVar1[1];
        fVar42 = pfVar1[2];
        fVar46 = pfVar1[3];
        local_1028._0_4_ = fVar64 * fVar29 - fVar107 * fVar115;
        local_1028._4_4_ = fVar72 * fVar40 - fVar109 * fVar117;
        local_1028._8_4_ = fVar74 * fVar42 - fVar111 * fVar119;
        local_1028._12_4_ = fVar76 * fVar46 - fVar113 * fVar121;
        fVar100 = fVar84 * fVar63 - fVar50 * local_f98;
        fVar102 = fVar84 * fVar71 - fVar58 * fStack_f94;
        fVar104 = fVar84 * fVar73 - fVar44 * fStack_f90;
        fVar106 = fVar84 * fVar75 - fVar48 * fStack_f8c;
        local_1018._0_4_ = fVar95 * fVar115 - fVar99 * fVar29;
        local_1018._4_4_ = fVar96 * fVar117 - fVar101 * fVar40;
        local_1018._8_4_ = fVar97 * fVar119 - fVar103 * fVar42;
        local_1018._12_4_ = fVar98 * fVar121 - fVar105 * fVar46;
        fVar88 = local_f98 * fVar116 - local_f88 * fVar63;
        fVar90 = fStack_f94 * fVar118 - fStack_f84 * fVar71;
        fVar92 = fStack_f90 * fVar120 - fStack_f80 * fVar73;
        fVar94 = fStack_f8c * fVar122 - fStack_f7c * fVar75;
        fVar56 = local_1038[0] * fVar84 +
                 local_1028._0_4_ * local_f88 + local_1018._0_4_ * local_f98;
        fVar60 = local_1038[1] * fVar84 +
                 local_1028._4_4_ * fStack_f84 + local_1018._4_4_ * fStack_f94;
        fVar45 = local_1038[2] * fVar84 +
                 local_1028._8_4_ * fStack_f80 + local_1018._8_4_ * fStack_f90;
        fVar49 = local_1038[3] * fVar84 +
                 local_1028._12_4_ * fStack_f7c + local_1018._12_4_ * fStack_f8c;
        uVar41 = (uint)fVar56 & 0x80000000;
        uVar43 = (uint)fVar60 & 0x80000000;
        uVar47 = (uint)fVar45 & 0x80000000;
        uVar51 = (uint)fVar49 & 0x80000000;
        local_10c8[0] =
             (float)((uint)(fVar115 * fVar88 + fVar99 * fVar100 + fVar64 * fVar108) ^ uVar41);
        local_10c8[1] =
             (float)((uint)(fVar117 * fVar90 + fVar101 * fVar102 + fVar72 * fVar110) ^ uVar43);
        local_10c8[2] =
             (float)((uint)(fVar119 * fVar92 + fVar103 * fVar104 + fVar74 * fVar112) ^ uVar47);
        local_10c8[3] =
             (float)((uint)(fVar121 * fVar94 + fVar105 * fVar106 + fVar76 * fVar114) ^ uVar51);
        local_10b8 = (float)((uint)(fVar88 * fVar29 + fVar100 * fVar95 + fVar108 * fVar107) ^ uVar41
                            );
        fStack_10b4 = (float)((uint)(fVar90 * fVar40 + fVar102 * fVar96 + fVar110 * fVar109) ^
                             uVar43);
        fStack_10b0 = (float)((uint)(fVar92 * fVar42 + fVar104 * fVar97 + fVar112 * fVar111) ^
                             uVar47);
        fStack_10ac = (float)((uint)(fVar94 * fVar46 + fVar106 * fVar98 + fVar114 * fVar113) ^
                             uVar51);
        local_1098 = ABS(fVar56);
        fStack_1094 = ABS(fVar60);
        fStack_1090 = ABS(fVar45);
        fStack_108c = ABS(fVar49);
        bVar10 = ((0.0 <= local_10b8 && 0.0 <= local_10c8[0]) && fVar56 != 0.0) &&
                 local_10c8[0] + local_10b8 <= local_1098;
        bVar11 = ((0.0 <= fStack_10b4 && 0.0 <= local_10c8[1]) && fVar60 != 0.0) &&
                 local_10c8[1] + fStack_10b4 <= fStack_1094;
        bVar9 = ((0.0 <= fStack_10b0 && 0.0 <= local_10c8[2]) && fVar45 != 0.0) &&
                local_10c8[2] + fStack_10b0 <= fStack_1090;
        bVar8 = ((0.0 <= fStack_10ac && 0.0 <= local_10c8[3]) && fVar49 != 0.0) &&
                local_10c8[3] + fStack_10ac <= fStack_108c;
        auVar7._4_4_ = -(uint)bVar11;
        auVar7._0_4_ = -(uint)bVar10;
        auVar7._8_4_ = -(uint)bVar9;
        auVar7._12_4_ = -(uint)bVar8;
        uVar30 = movmskps((int)unaff_R14,auVar7);
        unaff_R14 = (undefined1 (*) [16])(ulong)uVar30;
        if (uVar30 != 0) {
          local_10a8._0_4_ =
               (float)(uVar41 ^ (uint)(fVar50 * local_1038[0] +
                                      fVar116 * local_1028._0_4_ + fVar63 * local_1018._0_4_));
          local_10a8._4_4_ =
               (float)(uVar43 ^ (uint)(fVar58 * local_1038[1] +
                                      fVar118 * local_1028._4_4_ + fVar71 * local_1018._4_4_));
          local_10a8._8_4_ =
               (float)(uVar47 ^ (uint)(fVar44 * local_1038[2] +
                                      fVar120 * local_1028._8_4_ + fVar73 * local_1018._8_4_));
          local_10a8._12_4_ =
               (float)(uVar51 ^ (uint)(fVar48 * local_1038[3] +
                                      fVar122 * local_1028._12_4_ + fVar75 * local_1018._12_4_));
          fVar64 = *(float *)(ray + k * 4 + 0x30);
          fVar72 = *(float *)(ray + k * 4 + 0x80);
          bVar10 = (local_10a8._0_4_ <= fVar72 * local_1098 &&
                   fVar64 * local_1098 < local_10a8._0_4_) && bVar10;
          auVar37._0_4_ = -(uint)bVar10;
          bVar11 = (local_10a8._4_4_ <= fVar72 * fStack_1094 &&
                   fVar64 * fStack_1094 < local_10a8._4_4_) && bVar11;
          auVar37._4_4_ = -(uint)bVar11;
          bVar9 = (local_10a8._8_4_ <= fVar72 * fStack_1090 &&
                  fVar64 * fStack_1090 < local_10a8._8_4_) && bVar9;
          auVar37._8_4_ = -(uint)bVar9;
          bVar8 = (local_10a8._12_4_ <= fVar72 * fStack_108c &&
                  fVar64 * fStack_108c < local_10a8._12_4_) && bVar8;
          auVar37._12_4_ = -(uint)bVar8;
          uVar30 = movmskps(uVar30,auVar37);
          unaff_R14 = (undefined1 (*) [16])(ulong)uVar30;
          if (uVar30 != 0) {
            local_1078 = auVar37;
            pSVar4 = context->scene;
            auVar6._4_4_ = fStack_1094;
            auVar6._0_4_ = local_1098;
            auVar6._8_4_ = fStack_1090;
            auVar6._12_4_ = fStack_108c;
            auVar52 = rcpps(local_1018,auVar6);
            fVar64 = auVar52._0_4_;
            fVar72 = auVar52._4_4_;
            fVar74 = auVar52._8_4_;
            fVar76 = auVar52._12_4_;
            fVar64 = (1.0 - local_1098 * fVar64) * fVar64 + fVar64;
            fVar72 = (1.0 - fStack_1094 * fVar72) * fVar72 + fVar72;
            fVar74 = (1.0 - fStack_1090 * fVar74) * fVar74 + fVar74;
            fVar76 = (1.0 - fStack_108c * fVar76) * fVar76 + fVar76;
            auVar87._0_4_ = local_10a8._0_4_ * fVar64;
            auVar87._4_4_ = local_10a8._4_4_ * fVar72;
            auVar87._8_4_ = local_10a8._8_4_ * fVar74;
            auVar87._12_4_ = local_10a8._12_4_ * fVar76;
            local_1048 = auVar87;
            local_1068[0] = local_10c8[0] * fVar64;
            local_1068[1] = local_10c8[1] * fVar72;
            local_1068[2] = local_10c8[2] * fVar74;
            local_1068[3] = local_10c8[3] * fVar76;
            local_1058[0] = fVar64 * local_10b8;
            local_1058[1] = fVar72 * fStack_10b4;
            local_1058[2] = fVar74 * fStack_10b0;
            local_1058[3] = fVar76 * fStack_10ac;
            auVar67 = blendvps(_DAT_01feb9f0,auVar87,auVar37);
            auVar79._4_4_ = auVar67._0_4_;
            auVar79._0_4_ = auVar67._4_4_;
            auVar79._8_4_ = auVar67._12_4_;
            auVar79._12_4_ = auVar67._8_4_;
            auVar52 = minps(auVar79,auVar67);
            auVar53._0_8_ = auVar52._8_8_;
            auVar53._8_4_ = auVar52._0_4_;
            auVar53._12_4_ = auVar52._4_4_;
            auVar52 = minps(auVar53,auVar52);
            uVar30 = -(uint)(auVar52._0_4_ == auVar67._0_4_);
            uVar41 = -(uint)(auVar52._4_4_ == auVar67._4_4_);
            uVar43 = -(uint)(auVar52._8_4_ == auVar67._8_4_);
            uVar47 = -(uint)(auVar52._12_4_ == auVar67._12_4_);
            auVar70._4_4_ = uVar41;
            auVar70._0_4_ = uVar30;
            auVar68._0_4_ = uVar30 & auVar37._0_4_;
            auVar68._4_4_ = uVar41 & auVar37._4_4_;
            auVar68._8_4_ = uVar43 & auVar37._8_4_;
            auVar68._12_4_ = uVar47 & auVar37._12_4_;
            iVar23 = movmskps((int)pSVar4,auVar68);
            auVar69._8_4_ = 0xffffffff;
            auVar69._0_8_ = 0xffffffffffffffff;
            auVar69._12_4_ = 0xffffffff;
            if (iVar23 != 0) {
              auVar70._8_4_ = uVar43;
              auVar70._12_4_ = uVar47;
              auVar69 = auVar70;
            }
            lVar28 = lVar28 + uVar27;
            auVar38._0_4_ = auVar37._0_4_ & auVar69._0_4_;
            auVar38._4_4_ = auVar37._4_4_ & auVar69._4_4_;
            auVar38._8_4_ = auVar37._8_4_ & auVar69._8_4_;
            auVar38._12_4_ = auVar37._12_4_ & auVar69._12_4_;
            uVar24 = movmskps(iVar23,auVar38);
            uVar20 = CONCAT44((int)((ulong)pSVar4 >> 0x20),uVar24);
            lVar13 = 0;
            if (uVar20 != 0) {
              for (; (uVar20 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
              }
            }
            pRVar5 = (pSVar4->geometries).items;
            uVar30 = *(uint *)(ray + k * 4 + 0x90);
            uVar20 = (ulong)*(uint *)(lVar28 + 0x90 + lVar13 * 4);
            pGVar26 = pRVar5[uVar20].ptr;
            while ((pGVar26->mask & uVar30) == 0) {
              local_10c8[lVar13 + -4] = 0.0;
              uVar24 = (undefined4)((ulong)pGVar26 >> 0x20);
              iVar23 = movmskps((int)pGVar26,auVar37);
              unaff_R14 = (undefined1 (*) [16])CONCAT44(uVar24,iVar23);
              if (iVar23 == 0) goto LAB_00265776;
              auVar67 = blendvps(_DAT_01feb9f0,auVar87,auVar37);
              auVar80._4_4_ = auVar67._0_4_;
              auVar80._0_4_ = auVar67._4_4_;
              auVar80._8_4_ = auVar67._12_4_;
              auVar80._12_4_ = auVar67._8_4_;
              auVar52 = minps(auVar80,auVar67);
              auVar54._0_8_ = auVar52._8_8_;
              auVar54._8_4_ = auVar52._0_4_;
              auVar54._12_4_ = auVar52._4_4_;
              auVar52 = minps(auVar54,auVar52);
              auVar55._0_8_ =
                   CONCAT44(-(uint)(auVar52._4_4_ == auVar67._4_4_ && bVar11),
                            -(uint)(auVar52._0_4_ == auVar67._0_4_ && bVar10));
              auVar55._8_4_ = -(uint)(auVar52._8_4_ == auVar67._8_4_ && bVar9);
              auVar55._12_4_ = -(uint)(auVar52._12_4_ == auVar67._12_4_ && bVar8);
              iVar23 = movmskps(iVar23,auVar55);
              auVar39 = auVar37;
              if (iVar23 != 0) {
                auVar39._8_4_ = auVar55._8_4_;
                auVar39._0_8_ = auVar55._0_8_;
                auVar39._12_4_ = auVar55._12_4_;
              }
              uVar25 = movmskps(iVar23,auVar39);
              uVar20 = CONCAT44(uVar24,uVar25);
              lVar13 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                }
              }
              uVar20 = (ulong)*(uint *)(lVar28 + 0x90 + lVar13 * 4);
              pGVar26 = pRVar5[uVar20].ptr;
            }
            fVar64 = local_1068[lVar13];
            fVar72 = local_1058[lVar13];
            *(float *)(ray + k * 4 + 0x80) = local_1038[lVar13 + -4];
            *(float *)(ray + k * 4 + 0xc0) = local_1038[lVar13];
            *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1028 + lVar13 * 4);
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1018 + lVar13 * 4);
            *(float *)(ray + k * 4 + 0xf0) = fVar64;
            *(float *)(ray + k * 4 + 0x100) = fVar72;
            *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar28 + 0xa0 + lVar13 * 4);
            *(int *)(ray + k * 4 + 0x120) = (int)uVar20;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            uVar30 = context->user->instPrimID[0];
            unaff_R14 = (undefined1 (*) [16])(ulong)uVar30;
            *(uint *)(ray + k * 4 + 0x140) = uVar30;
          }
        }
LAB_00265776:
        lVar15 = lVar15 + 1;
      } while (lVar15 != uVar21 - 8);
    }
    iVar23 = *(int *)(ray + k * 4 + 0x80);
    fVar81 = local_fa8;
    fVar82 = fStack_fa4;
    fVar83 = fStack_fa0;
    fVar84 = fStack_f9c;
    iVar89 = iVar23;
    iVar91 = iVar23;
    iVar93 = iVar23;
    fVar64 = local_fb8;
    fVar72 = fStack_fb4;
    fVar74 = fStack_fb0;
    fVar76 = fStack_fac;
    fVar95 = local_fc8;
    fVar96 = fStack_fc4;
    fVar97 = fStack_fc0;
    fVar98 = fStack_fbc;
    fVar99 = local_fd8;
    fVar101 = fStack_fd4;
    fVar103 = fStack_fd0;
    fVar105 = fStack_fcc;
    fVar107 = local_fe8;
    fVar109 = fStack_fe4;
    fVar111 = fStack_fe0;
    fVar113 = fStack_fdc;
    fVar115 = local_ff8;
    fVar117 = fStack_ff4;
    fVar119 = fStack_ff0;
    fVar121 = fStack_fec;
    iVar123 = local_1008;
    iVar124 = iStack_1004;
    iVar125 = iStack_1000;
    iVar126 = iStack_ffc;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }